

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * get_enclosing(gravity_parser_t *parser,gnode_n tag)

{
  gnode_r *pgVar1;
  bool bVar2;
  gravity_parser_t *pgVar3;
  int iVar4;
  uint uVar5;
  
  pgVar1 = parser->declarations;
  if (pgVar1 == (gnode_r *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = (int)pgVar1->n;
  }
  if (iVar4 != 0) {
    uVar5 = iVar4 - 1;
    while (-1 < (int)uVar5) {
      if ((ulong)uVar5 < pgVar1->n) {
        pgVar3 = (gravity_parser_t *)pgVar1->p[uVar5];
      }
      else {
        pgVar3 = (gravity_parser_t *)0x0;
      }
      if (pgVar3 == (gravity_parser_t *)0x0) {
        bVar2 = false;
        parser = (gravity_parser_t *)0x0;
      }
      else if (*(gnode_n *)&pgVar3->lexer == tag) {
        bVar2 = false;
        parser = pgVar3;
      }
      else {
        uVar5 = uVar5 - 1;
        bVar2 = true;
      }
      if (!bVar2) {
        return (gnode_t *)parser;
      }
    }
  }
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *get_enclosing (gravity_parser_t *parser, gnode_n tag) {
    int32_t n = (int32_t)gnode_array_size(parser->declarations);
    if (!n) return NULL;

    --n;
    while (n >= 0) {
        gnode_t *decl = gnode_array_get(parser->declarations, n);
        if (!decl) return NULL;
        if (decl->tag == tag) return decl;
        --n;
    }

    return NULL;
}